

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

int check_results(void)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  string line1;
  string line2;
  ifstream f2;
  ifstream f1;
  undefined1 *local_480;
  size_t local_478;
  undefined1 local_470 [16];
  undefined1 *local_460;
  size_t local_458;
  undefined1 local_450 [16];
  long local_440 [4];
  byte abStack_420 [488];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,"./test_files/known_good_jlog.txt",_S_in);
  std::ifstream::ifstream((istream *)local_440,"./test_files/jlog.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    lVar5 = 0x3c;
    pcVar6 = "TESTS FAILED - couldn\'t open test_files/known_good_jlog.txt\n";
  }
  else {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      local_480 = local_470;
      local_478 = 0;
      local_470[0] = 0;
      local_458 = 0;
      local_450[0] = 0;
      local_460 = local_450;
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_480,cVar1);
        cVar1 = (char)(istream *)local_440;
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          cVar1 = std::ios::widen(cVar1 + (char)*(undefined8 *)(local_440[0] + -0x18));
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_440,(string *)&local_460,cVar1);
          if ((abStack_420[*(long *)(local_440[0] + -0x18)] & 2) == 0) {
            lVar5 = 0x71;
            pcVar6 = 
            "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n"
            ;
            poVar4 = (ostream *)&std::cerr;
            goto LAB_001151b3;
          }
          iVar2 = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"TESTS PASSED\n",0xd);
          goto LAB_001151bd;
        }
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + cVar1);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_440,(string *)&local_460,cVar1);
      } while (((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) &&
               (local_478 == local_458)) &&
              ((local_478 == 0 || (iVar2 = bcmp(local_480,local_460,local_478), iVar2 == 0))));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line "
                 ,0x55);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      lVar5 = 2;
      pcVar6 = ")\n";
LAB_001151b3:
      iVar2 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
LAB_001151bd:
      if (local_460 != local_450) {
        operator_delete(local_460);
      }
      if (local_480 != local_470) {
        operator_delete(local_480);
      }
      goto LAB_00115152;
    }
    lVar5 = 0x31;
    pcVar6 = "TESTS FAILED - couldn\'t open test_files/jlog.txt\n";
  }
  iVar2 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_00115152:
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  return iVar2;
}

Assistant:

int check_results()
{
    ifstream f1("./test_files/known_good_jlog.txt");
    ifstream f2("./test_files/jlog.txt");

    if (!f1.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/known_good_jlog.txt\n";
        return 1;
    }

    if (!f2.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/jlog.txt\n";
        return 1;
    }

    string line1;
    string line2;

    size_t line_number = 0;

    while (getline(f1, line1))
    {
        line_number++;

        if (getline(f2, line2))
        {
            if (line1 == line2)
            {
                continue;
            }
        }
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line " << line_number << ")\n";
        return 1;
    }

    (void)getline(f2, line2);

    if (f2.eof())
    {
        cout << "TESTS PASSED\n";
    }
    else
    {
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n";
        return 1;
    }

    return 0;
}